

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_constructor.h
# Opt level: O0

duk_ret_t dukglue::detail::call_native_constructor<false,MyClass>(duk_context *ctx)

{
  duk_bool_t dVar1;
  MyClass *val;
  MyClass *obj;
  duk_context *pdStack_10;
  type constructor_args;
  duk_context *ctx_local;
  
  pdStack_10 = ctx;
  dVar1 = duk_is_constructor_call(ctx);
  if (dVar1 == 0) {
    duk_error_raw(pdStack_10,-6,
                  "/workspace/llm4binary/github/license_c_cmakelists/Aloshi[P]dukglue/tests/../include/dukglue/detail_constructor.h"
                  ,0xd,"Constructor must be called with new T().");
  }
  get_stack_values<>(pdStack_10);
  val = apply_constructor<MyClass>((tuple<> *)((long)&obj + 7));
  duk_push_this(pdStack_10);
  duk_push_pointer(pdStack_10,val);
  duk_put_prop_string(pdStack_10,-2,anon_var_dwarf_c456);
  RefManager::register_native_object(pdStack_10,val);
  duk_pop(pdStack_10);
  return 0;
}

Assistant:

static duk_ret_t call_native_constructor(duk_context* ctx)
    {
      if (!duk_is_constructor_call(ctx)) {
        duk_error(ctx, DUK_RET_TYPE_ERROR, "Constructor must be called with new T().");
        return DUK_RET_TYPE_ERROR;
      }

      // construct the new instance
      auto constructor_args = dukglue::detail::get_stack_values<Ts...>(ctx);
      Cls* obj = dukglue::detail::apply_constructor<Cls>(std::move(constructor_args));

      duk_push_this(ctx);

      // make the new script object keep the pointer to the new object instance
      duk_push_pointer(ctx, obj);
      duk_put_prop_string(ctx, -2, "\xFF" "obj_ptr");

      // register it
	  if (!managed)
		dukglue::detail::RefManager::register_native_object(ctx, obj);

      duk_pop(ctx); // pop this

      return 0;
    }